

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfoMB *
embree::sse2::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  float fVar1;
  Geometry *pGVar2;
  Ref<embree::Geometry> *pRVar3;
  float fVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  size_t sVar7;
  BBox1f BVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  task *ptVar12;
  unsigned_long uVar13;
  runtime_error *prVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  long lVar18;
  ulong uVar19;
  size_t sVar20;
  float *pfVar21;
  _func_int **pp_Var22;
  size_t sVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  _func_int **pp_Var29;
  bool bVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  float fVar42;
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  BBox1f BVar45;
  BBox1f BVar46;
  size_t taskCount;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e21;
  _func_int **local_4e20;
  BBox1f local_4e18;
  long **local_4e10;
  task_traits local_4e08;
  mvector<PrimRefMB> *local_4e00;
  Scene **local_4df8;
  BuildProgressMonitor *local_4df0;
  size_t local_4de8;
  mvector<PrimRefMB> **local_4de0;
  Scene **local_4dd8;
  Scene *local_4dd0;
  GTypeMask local_4dc8;
  undefined1 local_4dc0;
  mvector<PrimRefMB> *local_4db8;
  BBox1f *local_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  undefined8 local_4d88;
  undefined8 uStack_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  unsigned_long local_4d48;
  unsigned_long uStack_4d40;
  size_t local_4d38;
  size_t sStack_4d30;
  float local_4d28;
  float fStack_4d24;
  float fStack_4d20;
  float fStack_4d1c;
  long *local_4d18;
  _func_int ***local_4d10;
  undefined8 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  _func_int **local_4848;
  ulong local_4840;
  undefined1 local_4838 [9356];
  float local_23ac [2271];
  
  local_4848 = (_func_int **)0x0;
  local_4dc0 = 1;
  uVar19 = 0;
  local_4e18 = t0t1;
  local_4e00 = prims;
  local_4df0 = progressMonitor;
  local_4de8 = numPrimRefs;
  local_4dd0 = scene;
  local_4dc8 = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar23 = (scene->geometries).size_active;
  if (sVar23 != 0) {
    uVar19 = 0;
    sVar20 = 0;
    do {
      pGVar2 = (scene->geometries).items[sVar20].ptr;
      if ((((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
          ((1 << (SUB41(pGVar2->field_8,0) & 0x1f) & types) == ~MTY_ALL)) ||
         (pGVar2->numTimeSteps == 1)) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)pGVar2->numPrimitives;
      }
      uVar19 = uVar19 + uVar15;
      sVar20 = sVar20 + 1;
    } while (sVar23 != sVar20);
  }
  local_4840 = uVar19;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar15 = uVar19 + 0x3ff >> 10;
  if ((ulong)(long)iVar10 < uVar15) {
    uVar15 = (long)iVar10;
  }
  uVar27 = 0x40;
  if (uVar15 < 0x40) {
    uVar27 = uVar15;
  }
  pp_Var29 = (_func_int **)(uVar27 + (uVar27 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  local_4848 = pp_Var29;
  if (1 < uVar15) {
    uVar27 = 0;
    uVar15 = uVar19 / (ulong)pp_Var29;
    pRVar3 = (scene->geometries).items;
    pp_Var22 = (_func_int **)0x1;
    lVar24 = 0;
    do {
      pGVar2 = pRVar3[lVar24].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
         (((1 << (SUB41(pGVar2->field_8,0) & 0x1f) & types) == ~MTY_ALL ||
          ((pGVar2->numTimeSteps == 1 || (uVar26 = (ulong)pGVar2->numPrimitives, uVar26 == 0)))))) {
        uVar26 = 0;
        lVar18 = 0;
      }
      else {
        uVar16 = ((long)pp_Var22 + 1) * uVar19;
        lVar18 = 0;
        uVar28 = 0;
        do {
          uVar11 = uVar15;
          uVar15 = uVar11;
          if ((uVar27 + uVar26 + lVar18 < uVar11) || (pp_Var29 <= pp_Var22)) break;
          local_4c48[(long)pp_Var22] = lVar24;
          uVar28 = uVar28 + (uVar11 - uVar27);
          local_4a48[(long)pp_Var22] = uVar28;
          pp_Var22 = (_func_int **)((long)pp_Var22 + 1);
          uVar15 = uVar16 / (ulong)local_4848;
          lVar18 = -uVar28;
          uVar16 = uVar16 + uVar19;
          uVar27 = uVar11;
          pp_Var29 = local_4848;
        } while (uVar28 < uVar26);
      }
      uVar27 = uVar26 + uVar27 + lVar18;
      lVar24 = lVar24 + 1;
    } while (pp_Var22 < pp_Var29);
  }
  local_4da8 = 0x7f8000007f800000;
  uStack_4da0 = 0x7f8000007f800000;
  local_4d98 = 0xff800000ff800000;
  uStack_4d90 = 0xff800000ff800000;
  local_4d88 = 0x7f8000007f800000;
  uStack_4d80 = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0x7f8000007f800000;
  uStack_4d60 = 0x7f8000007f800000;
  local_4d58 = 0xff800000ff800000;
  uStack_4d50 = 0xff800000ff800000;
  local_4d48 = 0;
  uStack_4d40 = 0;
  local_4d38 = 0;
  sStack_4d30 = 0;
  local_4d28 = 0.0;
  fStack_4d24 = 1.0;
  fStack_4d20 = 1.0;
  fStack_4d1c = 0.0;
  local_4db8 = local_4e00;
  local_4db0 = &local_4e18;
  local_4df8 = &local_4dd0;
  local_4d00 = &local_4df8;
  local_4cf0 = &local_4de0;
  local_4d10 = &local_4e20;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e21;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e20 = pp_Var29;
  local_4de0 = &local_4db8;
  local_4dd8 = local_4df8;
  local_4d08 = &local_4da8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e08.m_version_and_traits = 0;
  local_4e10 = &local_4d18;
  ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
  ptVar12->m_reserved[3] = 0;
  ptVar12->m_reserved[4] = 0;
  ptVar12->m_reserved[1] = 0;
  ptVar12->m_reserved[2] = 0;
  (ptVar12->super_task_traits).m_version_and_traits = 0;
  ptVar12->m_reserved[0] = 0;
  ptVar12->m_reserved[5] = 0;
  ptVar12->_vptr_task = (_func_int **)&PTR__task_0218a0c8;
  ptVar12[1]._vptr_task = pp_Var29;
  ptVar12[1].super_task_traits.m_version_and_traits = 0;
  ptVar12[1].m_reserved[0] = 1;
  ptVar12[1].m_reserved[1] = (uint64_t)&local_4e10;
  ptVar12[1].m_reserved[2] = 0;
  ptVar12[1].m_reserved[3] = 1;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  *(undefined4 *)&ptVar12[2]._vptr_task = 0;
  *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
  ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
  ptVar12[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
  local_4ce8 = 0;
  local_4ce0 = 1;
  local_4cd8.m_version_and_traits = 1;
  local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
  tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar9 != '\0') {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"task cancelled");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar31._8_8_ = uStack_4da0;
  aVar31._0_8_ = local_4da8;
  aVar32._8_8_ = uStack_4d90;
  aVar32._0_8_ = local_4d98;
  aVar34._8_8_ = uStack_4d80;
  aVar34._0_8_ = local_4d88;
  aVar36._8_8_ = uStack_4d70;
  aVar36._0_8_ = local_4d78;
  aVar38._8_8_ = uStack_4d60;
  aVar38._0_8_ = local_4d68;
  aVar40._8_8_ = uStack_4d50;
  aVar40._0_8_ = local_4d58;
  (__return_storage_ptr__->object_range)._begin = local_4d48;
  (__return_storage_ptr__->object_range)._end = uStack_4d40;
  BVar45.upper = fStack_4d24;
  BVar45.lower = local_4d28;
  BVar8.upper = fStack_4d1c;
  BVar8.lower = fStack_4d20;
  __return_storage_ptr__->max_time_range = BVar45;
  __return_storage_ptr__->time_range = BVar8;
  __return_storage_ptr__->num_time_segments = local_4d38;
  __return_storage_ptr__->max_num_time_segments = sStack_4d30;
  uVar13 = uStack_4d40;
  uVar17 = local_4d48;
  if (local_4e20 != (_func_int **)0x0) {
    sVar23 = __return_storage_ptr__->num_time_segments;
    sVar20 = __return_storage_ptr__->max_num_time_segments;
    pauVar25 = (undefined1 (*) [16])local_4838;
    BVar45 = __return_storage_ptr__->max_time_range;
    pp_Var29 = local_4e20;
    fVar4 = (__return_storage_ptr__->time_range).upper;
    fVar42 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar15 = *(ulong *)(pauVar25[7] + 8);
      uVar19 = *(ulong *)pauVar25[8];
      fVar1 = *(float *)(pauVar25[8] + 0xc);
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x240) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x241) = aVar32;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x242) = aVar34;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x243) = aVar36;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x244) = aVar38;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x245) = aVar40;
      aVar31.m128 = (__m128)minps(aVar31.m128,*pauVar25);
      aVar32.m128 = (__m128)maxps(aVar32.m128,pauVar25[1]);
      aVar34.m128 = (__m128)minps(aVar34.m128,pauVar25[2]);
      aVar36.m128 = (__m128)maxps(aVar36.m128,pauVar25[3]);
      aVar38.m128 = (__m128)minps(aVar38.m128,pauVar25[4]);
      aVar40.m128 = (__m128)maxps(aVar40.m128,pauVar25[5]);
      fVar43 = fVar42;
      if (*(float *)(pauVar25[8] + 8) <= fVar42) {
        fVar43 = *(float *)(pauVar25[8] + 8);
      }
      uVar17 = uVar17 + *(long *)pauVar25[6];
      uVar13 = uVar13 + *(long *)(pauVar25[6] + 8);
      sVar23 = sVar23 + *(long *)pauVar25[7];
      uVar5 = (__return_storage_ptr__->object_range)._begin;
      uVar6 = (__return_storage_ptr__->object_range)._end;
      sVar7 = __return_storage_ptr__->max_num_time_segments;
      *(size_t *)pauVar25[0x247] = __return_storage_ptr__->num_time_segments;
      *(size_t *)(pauVar25[0x247] + 8) = sVar7;
      *(unsigned_long *)pauVar25[0x246] = uVar5;
      *(unsigned_long *)(pauVar25[0x246] + 8) = uVar6;
      *(BBox1f *)(pauVar25 + 0x248) = BVar45;
      *(float *)(pauVar25[0x248] + 8) = fVar42;
      *(float *)(pauVar25[0x248] + 0xc) = fVar4;
      bVar30 = sVar20 < uVar15;
      if (sVar20 <= uVar15) {
        sVar20 = uVar15;
      }
      if (fVar1 <= fVar4) {
        fVar1 = fVar4;
      }
      uVar15 = CONCAT44((int)((uint)bVar30 << 0x1f) >> 0x1f,(int)((uint)bVar30 << 0x1f) >> 0x1f);
      BVar45 = (BBox1f)(~uVar15 & (ulong)BVar45 | uVar19 & uVar15);
      (__return_storage_ptr__->object_range)._begin = uVar17;
      (__return_storage_ptr__->object_range)._end = uVar13;
      __return_storage_ptr__->num_time_segments = sVar23;
      __return_storage_ptr__->max_num_time_segments = sVar20;
      pauVar25 = pauVar25 + 9;
      pp_Var29 = (_func_int **)((long)pp_Var29 + -1);
      fVar4 = fVar1;
      fVar42 = fVar43;
    } while (pp_Var29 != (_func_int **)0x0);
    __return_storage_ptr__->max_time_range = BVar45;
    (__return_storage_ptr__->time_range).lower = fVar43;
    (__return_storage_ptr__->time_range).upper = fVar1;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar32;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar36;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar40;
  if (uVar13 - uVar17 != local_4de8) {
    (**local_4df0->_vptr_BuildProgressMonitor)(local_4df0,0);
    pp_Var29 = local_4848;
    local_4da8 = 0x7f8000007f800000;
    uStack_4da0 = 0x7f8000007f800000;
    local_4d98 = 0xff800000ff800000;
    uStack_4d90 = 0xff800000ff800000;
    local_4d88 = 0x7f8000007f800000;
    uStack_4d80 = 0x7f8000007f800000;
    local_4d78 = 0xff800000ff800000;
    uStack_4d70 = 0xff800000ff800000;
    local_4d68 = 0x7f8000007f800000;
    uStack_4d60 = 0x7f8000007f800000;
    local_4d58 = 0xff800000ff800000;
    uStack_4d50 = 0xff800000ff800000;
    local_4d48 = 0;
    uStack_4d40 = 0;
    local_4d38 = 0;
    sStack_4d30 = 0;
    local_4d28 = 0.0;
    fStack_4d24 = 1.0;
    fStack_4d20 = 1.0;
    fStack_4d1c = 0.0;
    local_4db8 = local_4e00;
    local_4db0 = &local_4e18;
    local_4df8 = &local_4dd0;
    local_4e20 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e20;
    local_4d00 = &local_4df8;
    local_4cf8 = &local_4e21;
    local_4cf0 = &local_4de0;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4de0 = &local_4db8;
    local_4dd8 = local_4df8;
    local_4d08 = &local_4da8;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e10 = &local_4d18;
    if (pp_Var29 != (_func_int **)0x0) {
      local_4e08.m_version_and_traits = 0;
      ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
      ptVar12->m_reserved[3] = 0;
      ptVar12->m_reserved[4] = 0;
      ptVar12->m_reserved[1] = 0;
      ptVar12->m_reserved[2] = 0;
      (ptVar12->super_task_traits).m_version_and_traits = 0;
      ptVar12->m_reserved[0] = 0;
      ptVar12->m_reserved[5] = 0;
      ptVar12->_vptr_task = (_func_int **)&PTR__task_0218a110;
      ptVar12[1]._vptr_task = pp_Var29;
      ptVar12[1].super_task_traits.m_version_and_traits = 0;
      ptVar12[1].m_reserved[0] = 1;
      ptVar12[1].m_reserved[1] = (uint64_t)&local_4e10;
      ptVar12[1].m_reserved[2] = 0;
      ptVar12[1].m_reserved[3] = 1;
      iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar12[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
      ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
      ptVar12[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar9 != '\0') {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar14,"task cancelled");
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar44._8_8_ = uStack_4da0;
    aVar44._0_8_ = local_4da8;
    aVar41._8_8_ = uStack_4d90;
    aVar41._0_8_ = local_4d98;
    aVar39._8_8_ = uStack_4d80;
    aVar39._0_8_ = local_4d88;
    aVar37._8_8_ = uStack_4d70;
    aVar37._0_8_ = local_4d78;
    aVar35._8_8_ = uStack_4d60;
    aVar35._0_8_ = local_4d68;
    aVar33._8_8_ = uStack_4d50;
    aVar33._0_8_ = local_4d58;
    BVar46.upper = fStack_4d24;
    BVar46.lower = local_4d28;
    if (local_4e20 != (_func_int **)0x0) {
      pfVar21 = local_23ac;
      do {
        uVar19 = *(ulong *)(pfVar21 + -0x905);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0x23) = aVar44;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0x1f) = aVar41;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0x1b) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0x17) = aVar37;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0x13) = aVar35;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar21 + -0xf) = aVar33;
        *(unsigned_long *)(pfVar21 + -0xb) = local_4d48;
        *(unsigned_long *)(pfVar21 + -9) = uStack_4d40;
        *(size_t *)(pfVar21 + -7) = local_4d38;
        *(size_t *)(pfVar21 + -5) = sStack_4d30;
        *(BBox1f *)(pfVar21 + -3) = BVar46;
        pfVar21[-1] = fStack_4d20;
        *pfVar21 = fStack_4d1c;
        aVar44.m128 = (__m128)minps(aVar44.m128,*(undefined1 (*) [16])(pfVar21 + -0x923));
        aVar41.m128 = (__m128)maxps(aVar41.m128,*(undefined1 (*) [16])(pfVar21 + -0x91f));
        aVar39.m128 = (__m128)minps(aVar39.m128,*(undefined1 (*) [16])(pfVar21 + -0x91b));
        aVar37.m128 = (__m128)maxps(aVar37.m128,*(undefined1 (*) [16])(pfVar21 + -0x917));
        aVar35.m128 = (__m128)minps(aVar35.m128,*(undefined1 (*) [16])(pfVar21 + -0x913));
        aVar33.m128 = (__m128)maxps(aVar33.m128,*(undefined1 (*) [16])(pfVar21 + -0x90f));
        if (pfVar21[-0x901] <= fStack_4d20) {
          fStack_4d20 = pfVar21[-0x901];
        }
        local_4d48 = local_4d48 + *(long *)(pfVar21 + -0x90b);
        uStack_4d40 = uStack_4d40 + *(long *)(pfVar21 + -0x909);
        fVar4 = pfVar21[-0x900];
        if (pfVar21[-0x900] <= fStack_4d1c) {
          fVar4 = fStack_4d1c;
        }
        local_4d38 = local_4d38 + *(long *)(pfVar21 + -0x907);
        bVar30 = sStack_4d30 < uVar19;
        if (sStack_4d30 <= uVar19) {
          sStack_4d30 = uVar19;
        }
        uVar19 = CONCAT44((int)((uint)bVar30 << 0x1f) >> 0x1f,(int)((uint)bVar30 << 0x1f) >> 0x1f);
        BVar46 = (BBox1f)(~uVar19 & (ulong)BVar46 | *(ulong *)(pfVar21 + -0x903) & uVar19);
        pfVar21 = pfVar21 + 0x24;
        local_4e20 = (_func_int **)((long)local_4e20 + -1);
        fStack_4d1c = fVar4;
      } while (local_4e20 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar44;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar41;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar37;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar35;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar33;
    (__return_storage_ptr__->object_range)._begin = local_4d48;
    (__return_storage_ptr__->object_range)._end = uStack_4d40;
    __return_storage_ptr__->num_time_segments = local_4d38;
    __return_storage_ptr__->max_num_time_segments = sStack_4d30;
    __return_storage_ptr__->max_time_range = BVar46;
    (__return_storage_ptr__->time_range).lower = fStack_4d20;
  }
  __return_storage_ptr__->time_range = local_4e18;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            return mesh->createPrimRefMBArray(prims,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }